

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashlin.c
# Opt level: O0

void hashlin_grow_step(tommy_hashlin *hashlin)

{
  tommy_count_t tVar1;
  uint uVar2;
  long lVar3;
  tommy_node_struct *ptVar4;
  uint uVar5;
  void *pvVar6;
  tommy_hashlin_node **pptVar7;
  long in_FS_OFFSET;
  tommy_count_t pos;
  tommy_hashlin_node *j_next;
  tommy_hashlin_node *ptStack_48;
  tommy_count_t mask;
  tommy_hashlin_node *j;
  tommy_count_t split_target;
  tommy_hashlin_node **segment;
  tommy_hashlin *hashlin_local;
  tommy_hashlin_node **split [2];
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  if ((hashlin->state != 1) && (hashlin->bucket_max >> 1 < hashlin->count)) {
    if (hashlin->state == 0) {
      hashlin->low_max = hashlin->bucket_max;
      hashlin->low_mask = hashlin->bucket_mask;
      pvVar6 = lrtr_malloc((ulong)hashlin->low_max << 3);
      hashlin->bucket[hashlin->bucket_bit] =
           (tommy_hashlin_node **)((long)pvVar6 + (ulong)hashlin->low_max * -8);
      hashlin->bucket_bit = hashlin->bucket_bit + 1;
      hashlin->bucket_max = 1 << ((byte)hashlin->bucket_bit & 0x1f);
      hashlin->bucket_mask = hashlin->bucket_max - 1;
      hashlin->split = 0;
    }
    hashlin->state = 1;
  }
  if (hashlin->state == 1) {
    tVar1 = hashlin->count;
    do {
      if (tVar1 << 1 <= hashlin->split + hashlin->low_max) goto LAB_0010a912;
      pptVar7 = tommy_hashlin_pos(hashlin,hashlin->split);
      split[0] = tommy_hashlin_pos(hashlin,hashlin->split + hashlin->low_max);
      ptStack_48 = *pptVar7;
      *pptVar7 = (tommy_hashlin_node *)0x0;
      *split[0] = (tommy_hashlin_node *)0x0;
      uVar2 = hashlin->low_max;
      while (ptStack_48 != (tommy_node *)0x0) {
        ptVar4 = ptStack_48->next;
        uVar5 = (uint)((ptStack_48->key & uVar2) != 0);
        if (*split[(ulong)uVar5 - 1] == (tommy_hashlin_node *)0x0) {
          tommy_list_insert_first(split[(ulong)uVar5 - 1],ptStack_48);
          ptStack_48 = ptVar4;
        }
        else {
          tommy_list_insert_tail_not_empty(*split[(ulong)uVar5 - 1],ptStack_48);
          ptStack_48 = ptVar4;
        }
      }
      hashlin->split = hashlin->split + 1;
    } while (hashlin->split != hashlin->low_max);
    tommy_hashlin_stable(hashlin);
  }
LAB_0010a912:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

tommy_inline void hashlin_grow_step(tommy_hashlin* hashlin)
{
	/* grow if more than 50% full */
	if (hashlin->state != TOMMY_HASHLIN_STATE_GROW
		&& hashlin->count > hashlin->bucket_max / 2
	) {
		/* if we are stable, setup a new grow state */
		/* otherwise continue with the already setup shrink one */
		/* but in backward direction */
		if (hashlin->state == TOMMY_HASHLIN_STATE_STABLE) {
			tommy_hashlin_node** segment;

			/* set the lower size */
			hashlin->low_max = hashlin->bucket_max;
			hashlin->low_mask = hashlin->bucket_mask;

			/* allocate the new vector using malloc() and not calloc() */
			/* because data is fully initialized in the split process */
			segment = tommy_cast(tommy_hashlin_node**, tommy_malloc(hashlin->low_max * sizeof(tommy_hashlin_node*)));

			/* store it adjusting the offset */
			/* cast to ptrdiff_t to ensure to get a negative value */
			hashlin->bucket[hashlin->bucket_bit] = &segment[-(tommy_ptrdiff_t)hashlin->low_max];

			/* grow the hash size */
			++hashlin->bucket_bit;
			hashlin->bucket_max = 1 << hashlin->bucket_bit;
			hashlin->bucket_mask = hashlin->bucket_max - 1;

			/* start from the beginning going forward */
			hashlin->split = 0;
		}

		/* grow state */
		hashlin->state = TOMMY_HASHLIN_STATE_GROW;
	}

	/* if we are growing */
	if (hashlin->state == TOMMY_HASHLIN_STATE_GROW) {
		/* compute the split target required to finish the reallocation before the next resize */
		tommy_count_t split_target = 2 * hashlin->count;

		/* reallocate buckets until the split target */
		while (hashlin->split + hashlin->low_max < split_target) {
			tommy_hashlin_node** split[2];
			tommy_hashlin_node* j;
			tommy_count_t mask;

			/* get the low bucket */
			split[0] = tommy_hashlin_pos(hashlin, hashlin->split);

			/* get the high bucket */
			split[1] = tommy_hashlin_pos(hashlin, hashlin->split + hashlin->low_max);

			/* save the low bucket */
			j = *split[0];

			/* reinitialize the buckets */
			*split[0] = 0;
			*split[1] = 0;

			/* the bit used to identify the bucket */
			mask = hashlin->low_max;

			/* flush the bucket */
			while (j) {
				tommy_hashlin_node* j_next = j->next;
				tommy_count_t pos = (j->key & mask) != 0;
				if (*split[pos])
					tommy_list_insert_tail_not_empty(*split[pos], j);
				else
					tommy_list_insert_first(split[pos], j);
				j = j_next;
			}

			/* go forward */
			++hashlin->split;

			/* if we have finished, change the state */
			if (hashlin->split == hashlin->low_max) {
				/* go in stable mode */
				tommy_hashlin_stable(hashlin);
				break;
			}
		}
	}
}